

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidjson.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  Ch *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  char *pcVar8;
  ulong i;
  char cVar9;
  char *pcVar10;
  ulong uVar11;
  SizeType SVar12;
  uint i_00;
  int iVar13;
  byte *pbVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  byte *pbVar19;
  byte *pbVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  cVar9 = *is->src_;
  if (cVar9 == '\"') {
    ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler,false);
    return;
  }
  if (cVar9 == '[') {
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x206,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::StartArray(handler);
    if (bVar7) {
      SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,0);
        if (bVar7) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x211,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar12 = 1;
        while( true ) {
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          pcVar8 = is->src_;
          is->src_ = pcVar8 + 1;
          if (*pcVar8 != ',') break;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          SVar12 = SVar12 + 1;
        }
        if (*pcVar8 != ']') {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                          ,0x222,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          pcVar8 = pcVar8 + (1 - (long)is->head_);
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_001239d3;
        }
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,SVar12);
        if (bVar7) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x220,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x20a,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar8 = is->src_ + -(long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_001239d3:
    *(char **)(this + 0x38) = pcVar8;
    return;
  }
  if (cVar9 == 'f') {
    pcVar8 = is->src_;
    if (*pcVar8 != 'f') {
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x243,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar10 = pcVar8 + 2;
    is->src_ = pcVar10;
    if (pcVar8[1] == 'a') {
      pcVar10 = pcVar8 + 3;
      is->src_ = pcVar10;
      if (pcVar8[2] == 'l') {
        pcVar10 = pcVar8 + 4;
        is->src_ = pcVar10;
        if (pcVar8[3] == 's') {
          pcVar10 = pcVar8 + 5;
          is->src_ = pcVar10;
          if (pcVar8[4] == 'e') {
            bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::Bool(handler,false);
            if (bVar7) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                            ,0x248,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            pcVar10 = is->src_ + -(long)is->head_;
            *(undefined4 *)(this + 0x30) = 0x10;
            goto LAB_00123345;
          }
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x24b,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar10 = pcVar10 + ~(ulong)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_00123345:
    *(char **)(this + 0x38) = pcVar10;
    return;
  }
  if (cVar9 == '{') {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x1d4,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::StartObject(handler);
    if (bVar7) {
      SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
      pcVar8 = is->src_;
      cVar9 = *pcVar8;
      if (cVar9 != '}') {
        SVar12 = 1;
        while (cVar9 == '\"') {
          ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          pcVar8 = is->src_;
          is->src_ = pcVar8 + 1;
          if (*pcVar8 != ':') {
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                            ,0x1ed,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            pcVar8 = pcVar8 + (1 - (long)is->head_);
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0012377c;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          pcVar8 = is->src_;
          is->src_ = pcVar8 + 1;
          if (*pcVar8 != ',') {
            if (*pcVar8 != '}') {
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                              ,0x1fe,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              pcVar8 = pcVar8 + (1 - (long)is->head_);
              *(undefined4 *)(this + 0x30) = 6;
              goto LAB_0012377c;
            }
            bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndObject(handler,SVar12);
            if (bVar7) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                            ,0x1fc,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_0012376e;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          pcVar8 = is->src_;
          SVar12 = SVar12 + 1;
          cVar9 = *pcVar8;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x1e5,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        pcVar8 = pcVar8 + -(long)is->head_;
        *(undefined4 *)(this + 0x30) = 4;
        goto LAB_0012377c;
      }
      is->src_ = pcVar8 + 1;
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(handler,0);
      if (bVar7) {
        return;
      }
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x1df,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x1d8,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
LAB_0012376e:
    pcVar8 = is->src_ + -(long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0012377c:
    *(char **)(this + 0x38) = pcVar8;
    return;
  }
  if (cVar9 == 't') {
    pcVar8 = is->src_;
    if (*pcVar8 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x236,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar10 = pcVar8 + 2;
    is->src_ = pcVar10;
    if (pcVar8[1] == 'r') {
      pcVar10 = pcVar8 + 3;
      is->src_ = pcVar10;
      if (pcVar8[2] == 'u') {
        pcVar10 = pcVar8 + 4;
        is->src_ = pcVar10;
        if (pcVar8[3] == 'e') {
          bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Bool(handler,true);
          if (bVar7) {
            return;
          }
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                          ,0x23b,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          pcVar10 = is->src_ + -(long)is->head_;
          *(undefined4 *)(this + 0x30) = 0x10;
          goto LAB_00123257;
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x23e,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar10 = pcVar10 + ~(ulong)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_00123257:
    *(char **)(this + 0x38) = pcVar10;
    return;
  }
  if (cVar9 == 'n') {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar19 = (byte *)is->src_;
  bVar1 = *pbVar19;
  bVar6 = bVar1;
  if (bVar1 == 0x2d) {
    pbVar20 = pbVar19 + 1;
    pbVar19 = pbVar19 + 1;
    bVar6 = *pbVar20;
  }
  pCVar2 = is->head_;
  if (bVar6 == 0x30) {
    uVar16 = (uint)pbVar19[1];
    pbVar20 = pbVar19 + 1;
    dVar21 = 0.0;
    bVar7 = false;
    bVar3 = false;
    uVar11 = 0;
    i = 0;
    bVar4 = false;
    i_00 = 0;
LAB_00123ca6:
    if ((char)uVar16 == '.') {
      uVar16 = (uint)pbVar20[1];
      pbVar19 = pbVar20 + 1;
      if (9 < (byte)(pbVar20[1] - 0x30)) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x364,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        pbVar14 = pbVar19 + -(long)pCVar2;
        *(undefined4 *)(this + 0x30) = 0xe;
        goto LAB_0012405e;
      }
      iVar15 = 0;
      pbVar20 = pbVar19;
      if (!bVar7) {
        if (!bVar4) {
          i = (ulong)i_00;
        }
        iVar15 = 0;
        while ((('/' < (char)(byte)uVar16 && ((byte)uVar16 < 0x3a)) && (i >> 0x35 == 0))) {
          pbVar20 = pbVar19 + 1;
          pbVar19 = pbVar19 + 1;
          iVar15 = iVar15 + -1;
          i = (ulong)(uVar16 - 0x30) + i * 10;
          uVar11 = (ulong)((int)uVar11 + (uint)(i != 0));
          uVar16 = (uint)*pbVar20;
        }
        auVar23._8_4_ = (int)(i >> 0x20);
        auVar23._0_8_ = i;
        auVar23._12_4_ = 0x45300000;
        dVar21 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
        bVar3 = true;
        pbVar20 = pbVar19;
      }
      while ('/' < (char)(byte)uVar16) {
        if (0x39 < (byte)uVar16) goto LAB_00123d27;
        if ((int)uVar11 < 0x11) {
          dVar21 = dVar21 * 10.0 + (double)(int)(uVar16 - 0x30);
          iVar15 = iVar15 + -1;
          if (0.0 < dVar21) {
            uVar11 = (ulong)((int)uVar11 + 1);
          }
        }
        uVar16 = (uint)pbVar20[1];
        pbVar20 = pbVar20 + 1;
      }
      iVar13 = 0;
LAB_00123fa6:
      if (bVar3) {
        dVar21 = internal::StrtodNormalPrecision(dVar21,iVar13 + iVar15);
        if (bVar1 == 0x2d) {
          dVar21 = -dVar21;
        }
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Double(handler,dVar21);
      }
      else if (bVar4) {
        if (bVar1 == 0x2d) {
          bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int64(handler,-i);
        }
        else {
          bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint64(handler,i);
        }
      }
      else if (bVar1 == 0x2d) {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int(handler,-i_00);
      }
      else {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint(handler,i_00);
      }
      pbVar19 = pbVar20;
      if (bVar7 != false) goto LAB_00124062;
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3d6,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar14 = pbVar20 + -(long)pCVar2;
      *(undefined4 *)(this + 0x30) = 0x10;
    }
    else {
      iVar15 = 0;
LAB_00123d27:
      iVar13 = 0;
      if ((uVar16 | 0x20) != 0x65) goto LAB_00123fa6;
      uVar11 = (ulong)i_00;
      if (bVar4) {
        uVar11 = i;
      }
      if (!bVar3) {
        auVar22._8_4_ = (int)(uVar11 >> 0x20);
        auVar22._0_8_ = uVar11;
        auVar22._12_4_ = 0x45300000;
        dVar21 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
        bVar3 = true;
      }
      bVar6 = pbVar20[1];
      bVar7 = false;
      bVar5 = false;
      if (bVar6 == 0x2b) {
LAB_00123d8a:
        bVar7 = bVar5;
        bVar6 = pbVar20[2];
        pbVar19 = pbVar20 + 2;
      }
      else {
        if (bVar6 == 0x2d) {
          bVar5 = true;
          goto LAB_00123d8a;
        }
        pbVar19 = pbVar20 + 1;
      }
      if ((byte)(bVar6 - 0x30) < 10) {
        pbVar20 = pbVar19 + 1;
        iVar17 = bVar6 - 0x30;
        pbVar14 = pbVar20;
        if (bVar7) {
          while (pbVar20 = pbVar14, (byte)(*pbVar20 - 0x30) < 10) {
            iVar17 = iVar17 * 10 + (uint)*pbVar20 + -0x30;
            pbVar14 = pbVar20 + 1;
            if (0xccccccb < iVar17) {
              do {
                pbVar19 = pbVar20 + 1;
                pbVar20 = pbVar20 + 1;
                pbVar14 = pbVar20;
              } while ((byte)(*pbVar19 - 0x30) < 10);
            }
          }
LAB_00123f9b:
          iVar13 = -iVar17;
          if (!bVar7) {
            iVar13 = iVar17;
          }
          goto LAB_00123fa6;
        }
        pbVar14 = pbVar19 + (1 - (long)pCVar2);
        do {
          bVar6 = *pbVar20;
          if (9 < (byte)(bVar6 - 0x30)) goto LAB_00123f9b;
          pbVar20 = pbVar20 + 1;
          iVar17 = iVar17 * 10 + (uint)bVar6 + -0x30;
          pbVar14 = pbVar14 + 1;
        } while (iVar17 <= 0x134 - iVar15);
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x3ae,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_00124052:
        *(undefined4 *)(this + 0x30) = 0xd;
        pbVar19 = pbVar20;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x3b3,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        pbVar14 = pbVar19 + -(long)pCVar2;
        *(undefined4 *)(this + 0x30) = 0xf;
      }
    }
  }
  else {
    if ((byte)(bVar6 - 0x31) < 9) {
      i_00 = bVar6 - 0x30;
      uVar11 = 0;
      if (bVar1 != 0x2d) {
LAB_00123b77:
        bVar6 = pbVar19[uVar11 + 1];
        uVar18 = (ulong)bVar6;
        if (9 < (byte)(bVar6 - 0x30)) goto LAB_00123bc4;
        if (i_00 < 0x19999999) {
LAB_00123b95:
          i_00 = (i_00 * 10 + (uint)bVar6) - 0x30;
          uVar11 = uVar11 + 1;
          goto LAB_00123b77;
        }
        if (i_00 != 0x19999999) goto LAB_00123bef;
        if (bVar6 < 0x36) goto LAB_00123b95;
        i_00 = 0x19999999;
LAB_00123bef:
        pbVar20 = pbVar19 + uVar11 + 1;
        i = (ulong)i_00;
        if (bVar1 == 0x2d) {
          while( true ) {
            uVar16 = (uint)uVar18;
            if (9 < (byte)((byte)uVar18 - 0x30)) break;
            if ((0xccccccccccccccb < i) && ((i != 0xccccccccccccccc || (0x38 < (byte)uVar18))))
            goto LAB_00123f26;
            i = (uVar18 & 0xf) + i * 10;
            uVar11 = (ulong)((int)uVar11 + 1);
            uVar18 = (ulong)pbVar20[1];
            pbVar20 = pbVar20 + 1;
          }
        }
        else {
          while( true ) {
            uVar16 = (uint)uVar18;
            if (9 < (byte)((byte)uVar18 - 0x30)) break;
            if ((0x1999999999999998 < i) && ((i != 0x1999999999999999 || (0x35 < (byte)uVar18))))
            goto LAB_00123f26;
            i = (uVar18 & 0xf) + i * 10;
            uVar11 = (ulong)((int)uVar11 + 1);
            uVar18 = (ulong)pbVar20[1];
            pbVar20 = pbVar20 + 1;
          }
        }
        dVar21 = 0.0;
        bVar7 = false;
        bVar3 = false;
        goto LAB_00123ca3;
      }
      while( true ) {
        bVar6 = pbVar19[uVar11 + 1];
        uVar18 = (ulong)bVar6;
        if (9 < (byte)(bVar6 - 0x30)) break;
        if (0xccccccb < i_00) {
          if (i_00 != 0xccccccc) goto LAB_00123bef;
          if (0x38 < bVar6) {
            i_00 = 0xccccccc;
            uVar18 = 0x39;
            goto LAB_00123bef;
          }
        }
        i_00 = (i_00 * 10 + (uint)bVar6) - 0x30;
        uVar11 = uVar11 + 1;
      }
LAB_00123bc4:
      uVar16 = (uint)bVar6;
      pbVar20 = pbVar19 + uVar11 + 1;
      dVar21 = 0.0;
      bVar7 = false;
      bVar3 = false;
      i = 0;
      bVar4 = false;
      goto LAB_00123ca6;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x335,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pbVar14 = pbVar19 + -(long)pCVar2;
    *(undefined4 *)(this + 0x30) = 3;
  }
LAB_0012405e:
  *(byte **)(this + 0x38) = pbVar14;
LAB_00124062:
  is->src_ = (Ch *)pbVar19;
  is->head_ = pCVar2;
  return;
LAB_00123f26:
  auVar24._8_4_ = (int)(i >> 0x20);
  auVar24._0_8_ = i;
  auVar24._12_4_ = 0x45300000;
  dVar21 = (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  pbVar14 = pbVar20 + -(long)pCVar2;
  while (uVar16 = (uint)uVar18, (byte)((char)uVar18 - 0x30U) < 10) {
    if (1.7976931348623158e+307 <= dVar21) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x357,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      goto LAB_00124052;
    }
    dVar21 = dVar21 * 10.0 + (double)(int)(uVar16 - 0x30);
    pbVar19 = pbVar20 + 1;
    pbVar20 = pbVar20 + 1;
    pbVar14 = pbVar14 + 1;
    uVar18 = (ulong)*pbVar19;
  }
  bVar7 = true;
  bVar3 = true;
LAB_00123ca3:
  bVar4 = true;
  goto LAB_00123ca6;
}

Assistant:

Ch Peek() const { return *src_; }